

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::js::Generator::FindProvidesForFile
          (Generator *this,GeneratorOptions *options,Printer *printer,FileDescriptor *file,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *provided)

{
  int iVar1;
  Descriptor *desc;
  EnumDescriptor *enumdesc;
  undefined4 local_38;
  undefined4 local_34;
  int i_1;
  int i;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *provided_local;
  FileDescriptor *file_local;
  Printer *printer_local;
  GeneratorOptions *options_local;
  Generator *this_local;
  
  local_34 = 0;
  while( true ) {
    iVar1 = FileDescriptor::message_type_count(file);
    if (iVar1 <= local_34) break;
    desc = FileDescriptor::message_type(file,local_34);
    FindProvidesForMessage(this,options,printer,desc,provided);
    local_34 = local_34 + 1;
  }
  local_38 = 0;
  while( true ) {
    iVar1 = FileDescriptor::enum_type_count(file);
    if (iVar1 <= local_38) break;
    enumdesc = FileDescriptor::enum_type(file,local_38);
    FindProvidesForEnum(this,options,printer,enumdesc,provided);
    local_38 = local_38 + 1;
  }
  return;
}

Assistant:

void Generator::FindProvidesForFile(const GeneratorOptions& options,
                                    io::Printer* printer,
                                    const FileDescriptor* file,
                                    std::set<string>* provided) const {
  for (int i = 0; i < file->message_type_count(); i++) {
    FindProvidesForMessage(options, printer, file->message_type(i), provided);
  }
  for (int i = 0; i < file->enum_type_count(); i++) {
    FindProvidesForEnum(options, printer, file->enum_type(i), provided);
  }
}